

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall
DataSourceAmiga::decode_amiga_sprite
          (DataSourceAmiga *this,PBuffer *data,size_t width,size_t height,uint8_t *palette)

{
  element_type *this_00;
  element_type *this_01;
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_R9;
  PSpriteAmiga PVar2;
  int local_8c;
  uint8_t color;
  ulong uStack_88;
  int k;
  size_t i;
  size_t y;
  Color *res;
  uint8_t *src_2;
  size_t bp2s;
  byte *local_50;
  uint8_t *src_1;
  undefined1 local_39;
  long local_38;
  uint8_t *palette_local;
  size_t height_local;
  size_t width_local;
  PBuffer *data_local;
  DataSourceAmiga *this_local;
  PSpriteAmiga *sprite;
  
  local_39 = 0;
  src_1 = (uint8_t *)(height << 3);
  local_38 = in_R9;
  palette_local = palette;
  height_local = height;
  width_local = width;
  data_local = data;
  this_local = this;
  std::make_shared<DataSourceAmiga::SpriteAmiga,unsigned_long,unsigned_long&>
            ((unsigned_long *)this,(unsigned_long *)&src_1);
  this_00 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       width);
  local_50 = (byte *)Buffer::get_data(this_00);
  res = (Color *)(local_50 + height_local * (long)palette_local * 2);
  this_01 = std::
            __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  y = (size_t)SpriteAmiga::get_writable_data(this_01);
  for (i = 0; i < palette_local; i = i + 1) {
    for (uStack_88 = 0; uStack_88 < height_local; uStack_88 = uStack_88 + 1) {
      for (local_8c = 7; -1 < local_8c; local_8c = local_8c + -1) {
        bVar1 = (byte)local_8c;
        bVar1 = (byte)((int)(uint)*local_50 >> (bVar1 & 0x1f)) & 1 |
                (byte)(((int)(uint)local_50[height_local] >> (bVar1 & 0x1f) & 1U) << 1) |
                (byte)(((int)(uint)res->blue >> (bVar1 & 0x1f) & 1U) << 2) |
                (byte)(((int)(uint)(&res->blue)[height_local] >> (bVar1 & 0x1f) & 1U) << 3) | 0x10;
        *(undefined1 *)(y + 2) = *(undefined1 *)(local_38 + (int)((uint)bVar1 * 3));
        *(undefined1 *)(y + 1) = *(undefined1 *)(local_38 + (int)((uint)bVar1 * 3 + 1));
        *(undefined1 *)y = *(undefined1 *)(local_38 + (int)((uint)bVar1 * 3 + 2));
        *(undefined1 *)(y + 3) = 0xff;
        y = y + 4;
      }
      local_50 = local_50 + 1;
      res = (Color *)&res->green;
    }
    local_50 = local_50 + height_local;
    res = (Color *)(&res->blue + height_local);
  }
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::decode_amiga_sprite(PBuffer data, size_t width, size_t height,
                                     uint8_t *palette) {
  PSpriteAmiga sprite = std::make_shared<SpriteAmiga>(width*8, height);

  uint8_t *src_1 = reinterpret_cast<uint8_t*>(data->get_data());
  size_t bp2s = width * 2 * height;
  uint8_t *src_2 = src_1 + bp2s;
  Data::Sprite::Color *res = sprite->get_writable_data();

  for (size_t y = 0; y < height; y++) {
    for (size_t i = 0; i < width; i++) {
      for (int k = 7; k >= 0; k--) {
        uint8_t color = 0;
        color |= (((*src_1) >> k) & 0x01) << 0;
        color |= (((*(src_1 + width)) >> k) & 0x01) << 1;
        color |= (((*src_2) >> k) & 0x01) << 2;
        color |= (((*(src_2 + width)) >> k) & 0x01) << 3;
        color |= 0x10;
        res->red = palette[color*3+0];    // R
        res->green = palette[color*3+1];  // G
        res->blue = palette[color*3+2];   // B
        res->alpha = 0xFF;                // A
        res++;
      }
      src_1++;
      src_2++;
    }
    src_1 += width;
    src_2 += width;
  }

  return sprite;
}